

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

bool genVulkanFunctionsPH
               (QList<VkSpecParser::Command> *commands,
               QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
               QString *outputBase)

{
  QString *pQVar1;
  long lVar2;
  Command *pCVar3;
  char cVar4;
  char cVar5;
  QString *key;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QList<VkSpecParser::Command> *__range2;
  QByteArray local_a0;
  QStringBuilder<const_QString_&,_QString> local_88;
  QArrayDataPointer<QString> local_60;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_88.b.d.d = (Data *)0x0;
  local_88.b.d.ptr = L"_p.h";
  local_88.b.d.size = 4;
  local_88.a = outputBase;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>((QString *)&local_60,&local_88);
  QFile::QFile((QFile *)&local_48,(QString *)&local_60);
  if (&(local_60.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  cVar4 = QFile::open(&local_48,0x12);
  if (cVar4 == '\0') {
    genVulkanFunctionsPH();
  }
  else {
    if (VERSIONS.d.size == 0) {
      uVar6 = 0;
      uVar7 = 0;
    }
    else {
      pQVar1 = VERSIONS.d.ptr + VERSIONS.d.size;
      uVar7 = 0;
      uVar6 = 0;
      key = VERSIONS.d.ptr;
      do {
        local_88.a = (QString *)0x0;
        local_88.b.d.d = (Data *)0x0;
        local_88.b.d.ptr = (char16_t *)0x0;
        QMap<QString,_QList<QString>_>::value
                  ((QList<QString> *)&local_60,versionCommandMapping,key,(QList<QString> *)&local_88
                  );
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
        lVar2 = (commands->d).size;
        if (lVar2 != 0) {
          pCVar3 = (commands->d).ptr;
          lVar8 = 0;
          do {
            QVar9.m_data = *(storage_type_conflict **)((long)&(pCVar3->cmd).name.d.ptr + lVar8);
            QVar9.m_size = *(qsizetype *)((long)&(pCVar3->cmd).name.d.size + lVar8);
            cVar5 = QtPrivate::QStringList_contains((QList *)&local_60,QVar9,CaseSensitive);
            if (cVar5 != '\0') {
              uVar7 = uVar7 + (&pCVar3->deviceLevel)[lVar8];
              uVar6 = uVar6 + ((&pCVar3->deviceLevel)[lVar8] ^ 1);
            }
            lVar8 = lVar8 + 0x68;
          } while (lVar2 * 0x68 - lVar8 != 0);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
        key = key + 1;
      } while (key != pQVar1);
    }
    Preamble::get(&local_a0,&preamble,licHeaderFn);
    if (local_a0.d.ptr == (char *)0x0) {
      local_a0.d.ptr = (char *)&QByteArray::_empty;
    }
    QString::asprintf((char *)&local_60,
                      "%s\n#ifndef QVULKANFUNCTIONS_P_H\n#define QVULKANFUNCTIONS_P_H\n\n//\n//  W A R N I N G\n//  -------------\n//\n// This file is not part of the Qt API.  It exists purely as an\n// implementation detail.  This header file may change from version to\n// version without notice, or even be removed.\n//\n// We mean it.\n//\n\n#include \"qvulkanfunctions.h\"\n\nQT_BEGIN_NAMESPACE\n\nclass QVulkanInstance;\n\nclass QVulkanFunctionsPrivate\n{\npublic:\n    QVulkanFunctionsPrivate(QVulkanInstance *inst);\n\n    PFN_vkVoidFunction m_funcs[%d];\n};\n\nclass QVulkanDeviceFunctionsPrivate\n{\npublic:\n    QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device);\n\n    PFN_vkVoidFunction m_funcs[%d];\n};\n\nQT_END_NAMESPACE\n\n#endif // QVULKANFUNCTIONS_P_H\n"
                      ,local_a0.d.ptr,(ulong)uVar6,(ulong)uVar7);
    QString::toUtf8_helper((QString *)&local_88);
    QIODevice::write(&local_48);
    if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88.a,1,0x10);
      }
    }
    if (&(local_60.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_48.d.size) {
    __stack_chk_fail();
  }
  return (bool)cVar4;
}

Assistant:

bool genVulkanFunctionsPH(const QList<VkSpecParser::Command> &commands,
                          const QMap<QString, QStringList> &versionCommandMapping,
                          const QString &licHeaderFn,
                          const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral("_p.h"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char *s =
"%s\n"
"#ifndef QVULKANFUNCTIONS_P_H\n"
"#define QVULKANFUNCTIONS_P_H\n"
"\n"
"//\n"
"//  W A R N I N G\n"
"//  -------------\n"
"//\n"
"// This file is not part of the Qt API.  It exists purely as an\n"
"// implementation detail.  This header file may change from version to\n"
"// version without notice, or even be removed.\n"
"//\n"
"// We mean it.\n"
"//\n"
"\n"
"#include \"qvulkanfunctions.h\"\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n"
"class QVulkanInstance;\n"
"\n"
"class QVulkanFunctionsPrivate\n"
"{\n"
"public:\n"
"    QVulkanFunctionsPrivate(QVulkanInstance *inst);\n"
"\n"
"    PFN_vkVoidFunction m_funcs[%d];\n"
"};\n"
"\n"
"class QVulkanDeviceFunctionsPrivate\n"
"{\n"
"public:\n"
"    QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device);\n"
"\n"
"    PFN_vkVoidFunction m_funcs[%d];\n"
"};\n"
"\n"
"QT_END_NAMESPACE\n"
"\n"
"#endif // QVULKANFUNCTIONS_P_H\n";

    int devLevelCount = 0;
    int instLevelCount = 0;
    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            if (c.deviceLevel)
                devLevelCount += 1;
            else
                instLevelCount += 1;
        }
    }

    f.write(QString::asprintf(s, preamble.get(licHeaderFn).constData(), instLevelCount, devLevelCount).toUtf8());

    return true;
}